

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ObjAddFanin(Gli_Obj_t *pObj,Gli_Obj_t *pFanin)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (pObj->field_9).iFanin;
  if ((int)(*(uint *)pObj >> 4 & 7) <= iVar1) {
    __assert_fail("pObj->iFanin < (int)pObj->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                  ,0xf8,"void Gli_ObjAddFanin(Gli_Obj_t *, Gli_Obj_t *)");
  }
  if ((pFanin->field_10).iFanout < (int)(*(uint *)pFanin >> 7)) {
    uVar2 = pObj->Handle - pFanin->Handle;
    (pObj->field_9).iFanin = iVar1 + 1;
    pObj[1].uTruth[(long)iVar1 + -2] = uVar2;
    iVar1 = (pFanin->field_10).iFanout;
    (pFanin->field_10).iFanout = iVar1 + 1;
    pFanin[1].uTruth[(long)(int)((*(uint *)pFanin >> 4 & 7) + iVar1) + -2] = uVar2;
    return;
  }
  __assert_fail("pFanin->iFanout < (int)pFanin->nFanouts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                ,0xf9,"void Gli_ObjAddFanin(Gli_Obj_t *, Gli_Obj_t *)");
}

Assistant:

void Gli_ObjAddFanin( Gli_Obj_t * pObj, Gli_Obj_t * pFanin )
{ 
    assert( pObj->iFanin < (int)pObj->nFanins );
    assert( pFanin->iFanout < (int)pFanin->nFanouts );
    pFanin->Fanios[pFanin->nFanins + pFanin->iFanout++] = 
    pObj->Fanios[pObj->iFanin++] = pObj->Handle - pFanin->Handle;
}